

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation.cpp
# Opt level: O2

void QAbstractAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  Direction DVar2;
  QBindableInterface *pQVar3;
  Direction *pDVar4;
  long *plVar5;
  DeletionPolicy policy;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      finished((QAbstractAnimation *)_o);
      return;
    case 1:
      stateChanged((QAbstractAnimation *)_o,*_a[1],*_a[2]);
      return;
    case 2:
      currentLoopChanged((QAbstractAnimation *)_o,*_a[1]);
      return;
    case 3:
      directionChanged((QAbstractAnimation *)_o,*_a[1]);
      return;
    case 4:
      policy = *_a[1];
      break;
    case 5:
      policy = KeepWhenStopped;
      break;
    case 6:
      pause((QAbstractAnimation *)_o);
      return;
    case 7:
      resume((QAbstractAnimation *)_o);
      return;
    case 8:
      setPaused((QAbstractAnimation *)_o,*_a[1]);
      return;
    case 9:
      stop((QAbstractAnimation *)_o);
      return;
    case 10:
      pDVar4 = (Direction *)_a[1];
LAB_00360fb0:
      setCurrentTime((QAbstractAnimation *)_o,*pDVar4);
      return;
    default:
      goto switchD_00360dc1_caseD_3;
    }
    start((QAbstractAnimation *)_o,policy);
    return;
  case ReadProperty:
    if ((uint)_id < 6) {
      pDVar4 = (Direction *)*_a;
      switch(_id) {
      case 0:
        DVar2 = state((QAbstractAnimation *)_o);
        break;
      case 1:
        DVar2 = loopCount((QAbstractAnimation *)_o);
        break;
      case 2:
        DVar2 = currentTime((QAbstractAnimation *)_o);
        break;
      case 3:
        DVar2 = currentLoop((QAbstractAnimation *)_o);
        break;
      case 4:
        DVar2 = direction((QAbstractAnimation *)_o);
        break;
      case 5:
        DVar2 = (*_o->_vptr_QObject[0xc])();
      }
      *pDVar4 = DVar2;
    }
    break;
  case WriteProperty:
    pDVar4 = (Direction *)*_a;
    if (_id == 4) {
      setDirection((QAbstractAnimation *)_o,*pDVar4);
      return;
    }
    if (_id == 2) goto LAB_00360fb0;
    if (_id == 1) {
      setLoopCount((QAbstractAnimation *)_o,*pDVar4);
      return;
    }
    break;
  case IndexOfMethod:
    bVar1 = QtMocHelpers::indexOfMethod<void(QAbstractAnimation::*)()>
                      ((QtMocHelpers *)_a,(void **)finished,0,0);
    if (((!bVar1) &&
        (bVar1 = QtMocHelpers::
                 indexOfMethod<void(QAbstractAnimation::*)(QAbstractAnimation::State,QAbstractAnimation::State)>
                           ((QtMocHelpers *)_a,(void **)stateChanged,0,1), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QAbstractAnimation::*)(int)>
                          ((QtMocHelpers *)_a,(void **)currentLoopChanged,0,2), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QAbstractAnimation::*)(QAbstractAnimation::Direction)>
                ((QtMocHelpers *)_a,(void **)directionChanged,0,3);
      return;
    }
    break;
  case BindableProperty:
    switch(_id) {
    case 0:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[1].children.d.size;
      pQVar3 = &QtPrivate::
                QBindableInterfaceForProperty<const_QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>,_void>
                ::iface;
      break;
    case 1:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[1].metaObject;
      pQVar3 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>,_void>
                ::iface;
      break;
    case 2:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[1].field_0x30;
      pQVar3 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 3:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[1].metaObject + 4);
      pQVar3 = &QtPrivate::
                QBindableInterfaceForProperty<const_QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>,_void>
                ::iface;
      break;
    case 4:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[1].children.d.size + 4);
      pQVar3 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>,_void>
                ::iface;
      break;
    default:
      goto switchD_00360dc1_caseD_3;
    }
    plVar5[1] = (long)pQVar3;
  }
switchD_00360dc1_caseD_3:
  return;
}

Assistant:

void QAbstractAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractAnimation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished(); break;
        case 1: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::State>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::State>>(_a[2]))); break;
        case 2: _t->currentLoopChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->directionChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::Direction>>(_a[1]))); break;
        case 4: _t->start((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::DeletionPolicy>>(_a[1]))); break;
        case 5: _t->start(); break;
        case 6: _t->pause(); break;
        case 7: _t->resume(); break;
        case 8: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 9: _t->stop(); break;
        case 10: _t->setCurrentTime((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)()>(_a, &QAbstractAnimation::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(QAbstractAnimation::State , QAbstractAnimation::State )>(_a, &QAbstractAnimation::stateChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(int )>(_a, &QAbstractAnimation::currentLoopChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(QAbstractAnimation::Direction )>(_a, &QAbstractAnimation::directionChanged, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<State*>(_v) = _t->state(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->loopCount(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentTime(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->currentLoop(); break;
        case 4: *reinterpret_cast<Direction*>(_v) = _t->direction(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setLoopCount(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setCurrentTime(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setDirection(*reinterpret_cast<Direction*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableState(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableLoopCount(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentTime(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentLoop(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDirection(); break;
        default: break;
        }
    }
}